

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O1

Belief * __thiscall despot::Tag::InitialBelief(Tag *this,State *start,string *type)

{
  int iVar1;
  Belief *pBVar2;
  ostream *poVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)type);
  if (iVar1 == 0) {
    pBVar2 = ExactPrior(this);
    return pBVar2;
  }
  iVar1 = std::__cxx11::string::compare((char *)type);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)type);
    if (iVar1 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "[Tag::InitialBelief] Unsupported belief type: ");
      poVar3 = std::operator<<(poVar3,(string *)type);
      std::endl<char,std::char_traits<char>>(poVar3);
      exit(0);
    }
  }
  pBVar2 = ApproxPrior(this);
  return pBVar2;
}

Assistant:

Belief* Tag::InitialBelief(const State* start, string type) const {
	Belief* prior = NULL;
	if (type == "EXACT") {
		prior = ExactPrior();
	} else if (type == "DEFAULT" || type == "PARTICLE") {
		prior = ApproxPrior();
	} else {
		cerr << "[Tag::InitialBelief] Unsupported belief type: " << type << endl;
		exit(0);
	}

	return prior;
}